

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  Scene *pSVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  uint uVar22;
  undefined1 (*pauVar23) [16];
  long lVar24;
  byte bVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  ulong uVar29;
  long lVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  undefined1 (*pauVar37) [16];
  ulong uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar68 [64];
  undefined1 auVar72 [32];
  uint uVar74;
  uint uVar75;
  undefined1 auVar73 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [64];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined4 uVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  RTCFilterFunctionNArguments local_28f0;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  RTCHitN local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  uint local_23c0;
  uint uStack_23bc;
  uint uStack_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar52 [32];
  undefined1 auVar56 [32];
  
  pauVar23 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar91 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2520._4_4_ = fVar2;
  local_2520._0_4_ = fVar2;
  local_2520._8_4_ = fVar2;
  local_2520._12_4_ = fVar2;
  local_2520._16_4_ = fVar2;
  local_2520._20_4_ = fVar2;
  local_2520._24_4_ = fVar2;
  local_2520._28_4_ = fVar2;
  auVar61 = ZEXT3264(local_2520);
  fVar65 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_2540._4_4_ = fVar65;
  local_2540._0_4_ = fVar65;
  local_2540._8_4_ = fVar65;
  local_2540._12_4_ = fVar65;
  local_2540._16_4_ = fVar65;
  local_2540._20_4_ = fVar65;
  local_2540._24_4_ = fVar65;
  local_2540._28_4_ = fVar65;
  auVar64 = ZEXT3264(local_2540);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar65 = fVar65 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar21 = (tray->tfar).field_0.i[k];
  auVar42 = ZEXT3264(CONCAT428(iVar21,CONCAT424(iVar21,CONCAT420(iVar21,CONCAT416(iVar21,CONCAT412(
                                                  iVar21,CONCAT48(iVar21,CONCAT44(iVar21,iVar21)))))
                                               )));
  local_2500._8_4_ = 0x80000000;
  local_2500._0_8_ = 0x8000000080000000;
  local_2500._12_4_ = 0x80000000;
  local_2500._16_4_ = 0x80000000;
  local_2500._20_4_ = 0x80000000;
  local_2500._24_4_ = 0x80000000;
  local_2500._28_4_ = 0x80000000;
  local_2560._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_2560._8_4_ = -fVar1;
  local_2560._12_4_ = -fVar1;
  local_2560._16_4_ = -fVar1;
  local_2560._20_4_ = -fVar1;
  local_2560._24_4_ = -fVar1;
  local_2560._28_4_ = -fVar1;
  auVar68 = ZEXT3264(local_2560);
  local_2580._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_2580._8_4_ = -fVar2;
  local_2580._12_4_ = -fVar2;
  local_2580._16_4_ = -fVar2;
  local_2580._20_4_ = -fVar2;
  local_2580._24_4_ = -fVar2;
  local_2580._28_4_ = -fVar2;
  auVar73 = ZEXT3264(local_2580);
  local_25a0._0_8_ = CONCAT44(fVar65,fVar65) ^ 0x8000000080000000;
  local_25a0._8_4_ = -fVar65;
  local_25a0._12_4_ = -fVar65;
  local_25a0._16_4_ = -fVar65;
  local_25a0._20_4_ = -fVar65;
  local_25a0._24_4_ = -fVar65;
  local_25a0._28_4_ = -fVar65;
  auVar79 = ZEXT3264(local_25a0);
  iVar21 = (tray->tnear).field_0.i[k];
  local_25c0._4_4_ = iVar21;
  local_25c0._0_4_ = iVar21;
  local_25c0._8_4_ = iVar21;
  local_25c0._12_4_ = iVar21;
  local_25c0._16_4_ = iVar21;
  local_25c0._20_4_ = iVar21;
  local_25c0._24_4_ = iVar21;
  local_25c0._28_4_ = iVar21;
  auVar82 = ZEXT3264(local_25c0);
  local_25e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_25e0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar21 = 1 << ((uint)k & 0x1f);
  auVar63._4_4_ = iVar21;
  auVar63._0_4_ = iVar21;
  auVar63._8_4_ = iVar21;
  auVar63._12_4_ = iVar21;
  auVar63._16_4_ = iVar21;
  auVar63._20_4_ = iVar21;
  auVar63._24_4_ = iVar21;
  auVar63._28_4_ = iVar21;
  auVar45 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar63 = vpand_avx2(auVar63,auVar45);
  local_2620 = vpcmpeqd_avx2(auVar63,auVar45);
  auVar50._8_4_ = 0x3f800000;
  auVar50._0_8_ = 0x3f8000003f800000;
  auVar50._12_4_ = 0x3f800000;
  auVar50._16_4_ = 0x3f800000;
  auVar50._20_4_ = 0x3f800000;
  auVar50._24_4_ = 0x3f800000;
  auVar50._28_4_ = 0x3f800000;
  auVar45._8_4_ = 0xbf800000;
  auVar45._0_8_ = 0xbf800000bf800000;
  auVar45._12_4_ = 0xbf800000;
  auVar45._16_4_ = 0xbf800000;
  auVar45._20_4_ = 0xbf800000;
  auVar45._24_4_ = 0xbf800000;
  auVar45._28_4_ = 0xbf800000;
  local_2600 = vblendvps_avx(auVar50,auVar45,local_25e0);
LAB_0063118e:
  do {
    pauVar37 = pauVar23 + -1;
    pauVar23 = pauVar23 + -1;
    if (*(float *)(*pauVar37 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar29 = *(ulong *)*pauVar23;
      while ((uVar29 & 8) == 0) {
        auVar66 = auVar68._0_32_;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar34),auVar66,
                                  auVar91._0_32_);
        auVar50 = auVar61._0_32_;
        auVar72 = auVar73._0_32_;
        auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar36),auVar72,auVar50);
        auVar63 = vpmaxsd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar48));
        auVar39 = auVar64._0_32_;
        auVar76 = auVar79._0_32_;
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + uVar38),auVar76,auVar39);
        auVar45 = vpmaxsd_avx2(ZEXT1632(auVar43),auVar82._0_32_);
        local_2840 = vpmaxsd_avx2(auVar63,auVar45);
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + (uVar34 ^ 0x20)),auVar66,
                                  auVar91._0_32_);
        auVar48 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + (uVar36 ^ 0x20)),auVar72,
                                  auVar50);
        auVar63 = vpminsd_avx2(ZEXT1632(auVar43),ZEXT1632(auVar48));
        auVar43 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar29 + 0x40 + (uVar38 ^ 0x20)),auVar76,
                                  auVar39);
        auVar45 = vpminsd_avx2(ZEXT1632(auVar43),auVar42._0_32_);
        auVar63 = vpminsd_avx2(auVar63,auVar45);
        auVar63 = vpcmpgtd_avx2(local_2840,auVar63);
        iVar21 = vmovmskps_avx(auVar63);
        if (iVar21 == 0xff) {
          if (pauVar23 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_0063118e;
        }
        bVar25 = ~(byte)iVar21;
        uVar35 = uVar29 & 0xfffffffffffffff0;
        lVar33 = 0;
        for (uVar29 = (ulong)bVar25; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
          lVar33 = lVar33 + 1;
        }
        uVar29 = *(ulong *)(uVar35 + lVar33 * 8);
        uVar26 = bVar25 - 1 & (uint)bVar25;
        uVar27 = (ulong)uVar26;
        if (uVar26 != 0) {
          uVar22 = *(uint *)(local_2840 + lVar33 * 4);
          lVar33 = 0;
          for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar33 = lVar33 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          uVar32 = (ulong)uVar26;
          uVar27 = *(ulong *)(uVar35 + lVar33 * 8);
          uVar74 = *(uint *)(local_2840 + lVar33 * 4);
          if (uVar26 == 0) {
            if (uVar22 < uVar74) {
              *(ulong *)*pauVar23 = uVar27;
              *(uint *)(*pauVar23 + 8) = uVar74;
              pauVar23 = pauVar23 + 1;
            }
            else {
              *(ulong *)*pauVar23 = uVar29;
              *(uint *)(*pauVar23 + 8) = uVar22;
              pauVar23 = pauVar23 + 1;
              uVar29 = uVar27;
            }
          }
          else {
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar29;
            auVar43 = vpunpcklqdq_avx(auVar43,ZEXT416(uVar22));
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar27;
            auVar48 = vpunpcklqdq_avx(auVar48,ZEXT416(uVar74));
            lVar33 = 0;
            for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              lVar33 = lVar33 + 1;
            }
            uVar26 = uVar26 - 1 & uVar26;
            uVar29 = (ulong)uVar26;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = *(ulong *)(uVar35 + lVar33 * 8);
            auVar44 = vpunpcklqdq_avx(auVar53,ZEXT416(*(uint *)(local_2840 + lVar33 * 4)));
            auVar53 = vpcmpgtd_avx(auVar48,auVar43);
            if (uVar26 == 0) {
              auVar58 = vpshufd_avx(auVar53,0xaa);
              auVar53 = vblendvps_avx(auVar48,auVar43,auVar58);
              auVar43 = vblendvps_avx(auVar43,auVar48,auVar58);
              auVar48 = vpcmpgtd_avx(auVar44,auVar53);
              auVar58 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar44,auVar53,auVar58);
              auVar53 = vblendvps_avx(auVar53,auVar44,auVar58);
              auVar44 = vpcmpgtd_avx(auVar53,auVar43);
              auVar58 = vpshufd_avx(auVar44,0xaa);
              auVar44 = vblendvps_avx(auVar53,auVar43,auVar58);
              auVar43 = vblendvps_avx(auVar43,auVar53,auVar58);
              *pauVar23 = auVar43;
              pauVar23[1] = auVar44;
              uVar29 = auVar48._0_8_;
              pauVar23 = pauVar23 + 2;
            }
            else {
              lVar33 = 0;
              for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                lVar33 = lVar33 + 1;
              }
              uVar26 = uVar26 - 1 & uVar26;
              uVar27 = (ulong)uVar26;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(uVar35 + lVar33 * 8);
              auVar58 = vpunpcklqdq_avx(auVar58,ZEXT416(*(uint *)(local_2840 + lVar33 * 4)));
              if (uVar26 == 0) {
                auVar49 = vpshufd_avx(auVar53,0xaa);
                auVar53 = vblendvps_avx(auVar48,auVar43,auVar49);
                auVar43 = vblendvps_avx(auVar43,auVar48,auVar49);
                auVar48 = vpcmpgtd_avx(auVar58,auVar44);
                auVar49 = vpshufd_avx(auVar48,0xaa);
                auVar48 = vblendvps_avx(auVar58,auVar44,auVar49);
                auVar44 = vblendvps_avx(auVar44,auVar58,auVar49);
                auVar58 = vpcmpgtd_avx(auVar44,auVar43);
                auVar49 = vpshufd_avx(auVar58,0xaa);
                auVar58 = vblendvps_avx(auVar44,auVar43,auVar49);
                auVar43 = vblendvps_avx(auVar43,auVar44,auVar49);
                auVar44 = vpcmpgtd_avx(auVar48,auVar53);
                auVar49 = vpshufd_avx(auVar44,0xaa);
                auVar44 = vblendvps_avx(auVar48,auVar53,auVar49);
                auVar48 = vblendvps_avx(auVar53,auVar48,auVar49);
                auVar53 = vpcmpgtd_avx(auVar58,auVar48);
                auVar49 = vpshufd_avx(auVar53,0xaa);
                auVar53 = vblendvps_avx(auVar58,auVar48,auVar49);
                auVar48 = vblendvps_avx(auVar48,auVar58,auVar49);
                *pauVar23 = auVar43;
                pauVar23[1] = auVar48;
                pauVar23[2] = auVar53;
                uVar29 = auVar44._0_8_;
                pauVar37 = pauVar23 + 3;
              }
              else {
                *pauVar23 = auVar43;
                pauVar23[1] = auVar48;
                pauVar23[2] = auVar44;
                pauVar23[3] = auVar58;
                lVar33 = 0x30;
                do {
                  lVar30 = lVar33;
                  lVar33 = 0;
                  for (uVar29 = uVar27; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000
                      ) {
                    lVar33 = lVar33 + 1;
                  }
                  uVar29 = *(ulong *)(uVar35 + lVar33 * 8);
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar29;
                  auVar43 = vpunpcklqdq_avx(auVar44,ZEXT416(*(uint *)(local_2840 + lVar33 * 4)));
                  *(undefined1 (*) [16])(pauVar23[1] + lVar30) = auVar43;
                  uVar27 = uVar27 - 1 & uVar27;
                  lVar33 = lVar30 + 0x10;
                } while (uVar27 != 0);
                pauVar37 = (undefined1 (*) [16])(pauVar23[1] + lVar30);
                if (lVar30 + 0x10 != 0) {
                  lVar33 = 0x10;
                  pauVar28 = pauVar23;
                  do {
                    auVar43 = pauVar28[1];
                    pauVar28 = pauVar28 + 1;
                    uVar26 = vextractps_avx(auVar43,2);
                    lVar30 = lVar33;
                    do {
                      if (uVar26 <= *(uint *)(pauVar23[-1] + lVar30 + 8)) {
                        pauVar31 = (undefined1 (*) [16])(*pauVar23 + lVar30);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar23 + lVar30) =
                           *(undefined1 (*) [16])(pauVar23[-1] + lVar30);
                      lVar30 = lVar30 + -0x10;
                      pauVar31 = pauVar23;
                    } while (lVar30 != 0);
                    *pauVar31 = auVar43;
                    lVar33 = lVar33 + 0x10;
                  } while (pauVar37 != pauVar28);
                  uVar29 = *(ulong *)*pauVar37;
                }
              }
              auVar61 = ZEXT3264(auVar50);
              auVar64 = ZEXT3264(auVar39);
              auVar68 = ZEXT3264(auVar66);
              auVar73 = ZEXT3264(auVar72);
              auVar79 = ZEXT3264(auVar76);
              auVar82 = ZEXT3264(auVar82._0_32_);
              pauVar23 = pauVar37;
            }
          }
        }
      }
      uVar35 = (ulong)((uint)uVar29 & 0xf);
      if (uVar35 != 8) {
        uVar29 = uVar29 & 0xfffffffffffffff0;
        lVar33 = 0;
        do {
          lVar24 = lVar33 * 0xe0;
          lVar30 = uVar29 + 0xd0 + lVar24;
          local_2860 = *(undefined8 *)(lVar30 + 0x10);
          uStack_2858 = *(undefined8 *)(lVar30 + 0x18);
          lVar30 = uVar29 + 0xc0 + lVar24;
          local_24e0 = *(undefined8 *)(lVar30 + 0x10);
          uStack_24d8 = *(undefined8 *)(lVar30 + 0x18);
          uStack_24d0 = local_24e0;
          uStack_24c8 = uStack_24d8;
          uStack_2850 = local_2860;
          uStack_2848 = uStack_2858;
          auVar55._16_16_ = *(undefined1 (*) [16])(uVar29 + 0x60 + lVar24);
          auVar55._0_16_ = *(undefined1 (*) [16])(uVar29 + lVar24);
          auVar59._16_16_ = *(undefined1 (*) [16])(uVar29 + 0x70 + lVar24);
          auVar59._0_16_ = *(undefined1 (*) [16])(uVar29 + 0x10 + lVar24);
          auVar62._16_16_ = *(undefined1 (*) [16])(uVar29 + 0x80 + lVar24);
          auVar62._0_16_ = *(undefined1 (*) [16])(uVar29 + 0x20 + lVar24);
          auVar43 = *(undefined1 (*) [16])(uVar29 + 0x30 + lVar24);
          auVar39._16_16_ = auVar43;
          auVar39._0_16_ = auVar43;
          auVar48 = *(undefined1 (*) [16])(uVar29 + 0x40 + lVar24);
          auVar46._16_16_ = auVar48;
          auVar46._0_16_ = auVar48;
          auVar53 = *(undefined1 (*) [16])(uVar29 + 0x50 + lVar24);
          auVar51._16_16_ = auVar53;
          auVar51._0_16_ = auVar53;
          auVar53 = *(undefined1 (*) [16])(uVar29 + 0x90 + lVar24);
          auVar57._16_16_ = auVar53;
          auVar57._0_16_ = auVar53;
          auVar53 = *(undefined1 (*) [16])(uVar29 + 0xa0 + lVar24);
          auVar77._16_16_ = auVar53;
          auVar77._0_16_ = auVar53;
          auVar53 = *(undefined1 (*) [16])(uVar29 + 0xb0 + lVar24);
          auVar80._16_16_ = auVar53;
          auVar80._0_16_ = auVar53;
          auVar45 = vsubps_avx(auVar55,auVar39);
          auVar63 = vsubps_avx(auVar59,auVar46);
          auVar50 = vsubps_avx(auVar62,auVar51);
          auVar39 = vsubps_avx(auVar57,auVar55);
          auVar66 = vsubps_avx(auVar77,auVar59);
          auVar72 = vsubps_avx(auVar80,auVar62);
          auVar76._4_4_ = auVar63._4_4_ * auVar72._4_4_;
          auVar76._0_4_ = auVar63._0_4_ * auVar72._0_4_;
          auVar76._8_4_ = auVar63._8_4_ * auVar72._8_4_;
          auVar76._12_4_ = auVar63._12_4_ * auVar72._12_4_;
          auVar76._16_4_ = auVar63._16_4_ * auVar72._16_4_;
          auVar76._20_4_ = auVar63._20_4_ * auVar72._20_4_;
          auVar76._24_4_ = auVar63._24_4_ * auVar72._24_4_;
          auVar76._28_4_ = auVar43._12_4_;
          auVar44 = vfmsub231ps_fma(auVar76,auVar66,auVar50);
          uVar86 = *(undefined4 *)(ray + k * 4);
          auVar83._4_4_ = uVar86;
          auVar83._0_4_ = uVar86;
          auVar83._8_4_ = uVar86;
          auVar83._12_4_ = uVar86;
          auVar83._16_4_ = uVar86;
          auVar83._20_4_ = uVar86;
          auVar83._24_4_ = uVar86;
          auVar83._28_4_ = uVar86;
          uVar86 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar87._4_4_ = uVar86;
          auVar87._0_4_ = uVar86;
          auVar87._8_4_ = uVar86;
          auVar87._12_4_ = uVar86;
          auVar87._16_4_ = uVar86;
          auVar87._20_4_ = uVar86;
          auVar87._24_4_ = uVar86;
          auVar87._28_4_ = uVar86;
          uVar86 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar89._4_4_ = uVar86;
          auVar89._0_4_ = uVar86;
          auVar89._8_4_ = uVar86;
          auVar89._12_4_ = uVar86;
          auVar89._16_4_ = uVar86;
          auVar89._20_4_ = uVar86;
          auVar89._24_4_ = uVar86;
          auVar89._28_4_ = uVar86;
          fVar1 = *(float *)(ray + k * 4 + 0x80);
          auVar78._4_4_ = fVar1;
          auVar78._0_4_ = fVar1;
          auVar78._8_4_ = fVar1;
          auVar78._12_4_ = fVar1;
          auVar78._16_4_ = fVar1;
          auVar78._20_4_ = fVar1;
          auVar78._24_4_ = fVar1;
          auVar78._28_4_ = fVar1;
          auVar12._4_4_ = auVar50._4_4_ * auVar39._4_4_;
          auVar12._0_4_ = auVar50._0_4_ * auVar39._0_4_;
          auVar12._8_4_ = auVar50._8_4_ * auVar39._8_4_;
          auVar12._12_4_ = auVar50._12_4_ * auVar39._12_4_;
          auVar12._16_4_ = auVar50._16_4_ * auVar39._16_4_;
          auVar12._20_4_ = auVar50._20_4_ * auVar39._20_4_;
          auVar12._24_4_ = auVar50._24_4_ * auVar39._24_4_;
          auVar12._28_4_ = auVar48._12_4_;
          auVar76 = vsubps_avx(auVar55,auVar83);
          fVar2 = *(float *)(ray + k * 4 + 0xa0);
          auVar84._4_4_ = fVar2;
          auVar84._0_4_ = fVar2;
          auVar84._8_4_ = fVar2;
          auVar84._12_4_ = fVar2;
          auVar84._16_4_ = fVar2;
          auVar84._20_4_ = fVar2;
          auVar84._24_4_ = fVar2;
          auVar84._28_4_ = fVar2;
          auVar58 = vfmsub231ps_fma(auVar12,auVar72,auVar45);
          auVar12 = vsubps_avx(auVar59,auVar87);
          fVar65 = *(float *)(ray + k * 4 + 0xc0);
          auVar88._4_4_ = fVar65;
          auVar88._0_4_ = fVar65;
          auVar88._8_4_ = fVar65;
          auVar88._12_4_ = fVar65;
          auVar88._16_4_ = fVar65;
          auVar88._20_4_ = fVar65;
          auVar88._24_4_ = fVar65;
          auVar88._28_4_ = fVar65;
          auVar46 = vsubps_avx(auVar62,auVar89);
          auVar13._4_4_ = fVar1 * auVar12._4_4_;
          auVar13._0_4_ = fVar1 * auVar12._0_4_;
          auVar13._8_4_ = fVar1 * auVar12._8_4_;
          auVar13._12_4_ = fVar1 * auVar12._12_4_;
          auVar13._16_4_ = fVar1 * auVar12._16_4_;
          auVar13._20_4_ = fVar1 * auVar12._20_4_;
          auVar13._24_4_ = fVar1 * auVar12._24_4_;
          auVar13._28_4_ = uVar86;
          auVar43 = vfmsub231ps_fma(auVar13,auVar76,auVar84);
          auVar14._4_4_ = auVar72._4_4_ * auVar43._4_4_;
          auVar14._0_4_ = auVar72._0_4_ * auVar43._0_4_;
          auVar14._8_4_ = auVar72._8_4_ * auVar43._8_4_;
          auVar14._12_4_ = auVar72._12_4_ * auVar43._12_4_;
          auVar14._16_4_ = auVar72._16_4_ * 0.0;
          auVar14._20_4_ = auVar72._20_4_ * 0.0;
          auVar14._24_4_ = auVar72._24_4_ * 0.0;
          auVar14._28_4_ = auVar72._28_4_;
          auVar90._0_4_ = auVar50._0_4_ * auVar43._0_4_;
          auVar90._4_4_ = auVar50._4_4_ * auVar43._4_4_;
          auVar90._8_4_ = auVar50._8_4_ * auVar43._8_4_;
          auVar90._12_4_ = auVar50._12_4_ * auVar43._12_4_;
          auVar90._16_4_ = auVar50._16_4_ * 0.0;
          auVar90._20_4_ = auVar50._20_4_ * 0.0;
          auVar90._24_4_ = auVar50._24_4_ * 0.0;
          auVar90._28_4_ = 0;
          auVar72._4_4_ = fVar65 * auVar76._4_4_;
          auVar72._0_4_ = fVar65 * auVar76._0_4_;
          auVar72._8_4_ = fVar65 * auVar76._8_4_;
          auVar72._12_4_ = fVar65 * auVar76._12_4_;
          auVar72._16_4_ = fVar65 * auVar76._16_4_;
          auVar72._20_4_ = fVar65 * auVar76._20_4_;
          auVar72._24_4_ = fVar65 * auVar76._24_4_;
          auVar72._28_4_ = auVar50._28_4_;
          auVar48 = vfmsub231ps_fma(auVar72,auVar46,auVar78);
          auVar43 = vfmadd231ps_fma(auVar14,ZEXT1632(auVar48),auVar66);
          auVar48 = vfmadd231ps_fma(auVar90,auVar63,ZEXT1632(auVar48));
          auVar15._4_4_ = auVar45._4_4_ * auVar66._4_4_;
          auVar15._0_4_ = auVar45._0_4_ * auVar66._0_4_;
          auVar15._8_4_ = auVar45._8_4_ * auVar66._8_4_;
          auVar15._12_4_ = auVar45._12_4_ * auVar66._12_4_;
          auVar15._16_4_ = auVar45._16_4_ * auVar66._16_4_;
          auVar15._20_4_ = auVar45._20_4_ * auVar66._20_4_;
          auVar15._24_4_ = auVar45._24_4_ * auVar66._24_4_;
          auVar15._28_4_ = auVar66._28_4_;
          auVar49 = vfmsub231ps_fma(auVar15,auVar39,auVar63);
          auVar66._4_4_ = fVar2 * auVar46._4_4_;
          auVar66._0_4_ = fVar2 * auVar46._0_4_;
          auVar66._8_4_ = fVar2 * auVar46._8_4_;
          auVar66._12_4_ = fVar2 * auVar46._12_4_;
          auVar66._16_4_ = fVar2 * auVar46._16_4_;
          auVar66._20_4_ = fVar2 * auVar46._20_4_;
          auVar66._24_4_ = fVar2 * auVar46._24_4_;
          auVar66._28_4_ = auVar63._28_4_;
          auVar54 = vfmsub231ps_fma(auVar66,auVar12,auVar88);
          fVar1 = auVar49._0_4_;
          fVar2 = auVar49._4_4_;
          auVar16._4_4_ = fVar65 * fVar2;
          auVar16._0_4_ = fVar65 * fVar1;
          fVar7 = auVar49._8_4_;
          auVar16._8_4_ = fVar65 * fVar7;
          fVar8 = auVar49._12_4_;
          auVar16._12_4_ = fVar65 * fVar8;
          auVar16._16_4_ = fVar65 * 0.0;
          auVar16._20_4_ = fVar65 * 0.0;
          auVar16._24_4_ = fVar65 * 0.0;
          auVar16._28_4_ = fVar65;
          auVar53 = vfmadd231ps_fma(auVar16,ZEXT1632(auVar58),auVar84);
          auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),ZEXT1632(auVar44),auVar78);
          auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),ZEXT1632(auVar54),auVar39);
          auVar63 = vandps_avx(ZEXT1632(auVar53),local_2500);
          uVar26 = auVar63._0_4_;
          local_2840._0_4_ = (float)(uVar26 ^ auVar43._0_4_);
          uVar22 = auVar63._4_4_;
          local_2840._4_4_ = (float)(uVar22 ^ auVar43._4_4_);
          uVar74 = auVar63._8_4_;
          local_2840._8_4_ = (float)(uVar74 ^ auVar43._8_4_);
          uVar75 = auVar63._12_4_;
          local_2840._12_4_ = (float)(uVar75 ^ auVar43._12_4_);
          local_2800._16_4_ = auVar63._16_4_;
          local_2840._16_4_ = local_2800._16_4_;
          local_2800._20_4_ = auVar63._20_4_;
          local_2840._20_4_ = local_2800._20_4_;
          local_2800._24_4_ = auVar63._24_4_;
          local_2840._24_4_ = local_2800._24_4_;
          local_2800._28_4_ = auVar63._28_4_;
          local_2840._28_4_ = local_2800._28_4_;
          auVar43 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar45,ZEXT1632(auVar54));
          local_2820._0_4_ = (float)(uVar26 ^ auVar43._0_4_);
          local_2820._4_4_ = (float)(uVar22 ^ auVar43._4_4_);
          local_2820._8_4_ = (float)(uVar74 ^ auVar43._8_4_);
          local_2820._12_4_ = (float)(uVar75 ^ auVar43._12_4_);
          local_2820._16_4_ = local_2800._16_4_;
          local_2820._20_4_ = local_2800._20_4_;
          local_2820._24_4_ = local_2800._24_4_;
          local_2820._28_4_ = local_2800._28_4_;
          auVar63 = vcmpps_avx(local_2840,ZEXT832(0) << 0x20,5);
          auVar45 = vcmpps_avx(local_2820,ZEXT832(0) << 0x20,5);
          auVar63 = vandps_avx(auVar63,auVar45);
          auVar67._8_4_ = 0x7fffffff;
          auVar67._0_8_ = 0x7fffffff7fffffff;
          auVar67._12_4_ = 0x7fffffff;
          auVar67._16_4_ = 0x7fffffff;
          auVar67._20_4_ = 0x7fffffff;
          auVar67._24_4_ = 0x7fffffff;
          auVar67._28_4_ = 0x7fffffff;
          local_27e0 = vandps_avx(ZEXT1632(auVar53),auVar67);
          auVar45 = vcmpps_avx(ZEXT1632(auVar53),ZEXT832(0) << 0x20,4);
          auVar63 = vandps_avx(auVar63,auVar45);
          auVar81._0_4_ = local_2840._0_4_ + local_2820._0_4_;
          auVar81._4_4_ = local_2840._4_4_ + local_2820._4_4_;
          auVar81._8_4_ = local_2840._8_4_ + local_2820._8_4_;
          auVar81._12_4_ = local_2840._12_4_ + local_2820._12_4_;
          auVar81._16_4_ = local_2800._16_4_ + local_2800._16_4_;
          auVar81._20_4_ = local_2800._20_4_ + local_2800._20_4_;
          auVar81._24_4_ = local_2800._24_4_ + local_2800._24_4_;
          auVar81._28_4_ = local_2800._28_4_ + local_2800._28_4_;
          auVar45 = vcmpps_avx(auVar81,local_27e0,2);
          auVar50 = auVar45 & auVar63;
          if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar50 >> 0x7f,0) != '\0') ||
                (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar50 >> 0xbf,0) != '\0') ||
              (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar50[0x1f] < '\0') {
            auVar63 = vandps_avx(auVar63,auVar45);
            auVar43 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
            auVar17._4_4_ = fVar2 * auVar46._4_4_;
            auVar17._0_4_ = fVar1 * auVar46._0_4_;
            auVar17._8_4_ = fVar7 * auVar46._8_4_;
            auVar17._12_4_ = fVar8 * auVar46._12_4_;
            auVar17._16_4_ = auVar46._16_4_ * 0.0;
            auVar17._20_4_ = auVar46._20_4_ * 0.0;
            auVar17._24_4_ = auVar46._24_4_ * 0.0;
            auVar17._28_4_ = auVar46._28_4_;
            auVar48 = vfmadd213ps_fma(auVar12,ZEXT1632(auVar58),auVar17);
            auVar48 = vfmadd213ps_fma(auVar76,ZEXT1632(auVar44),ZEXT1632(auVar48));
            local_2800._0_4_ = (float)(uVar26 ^ auVar48._0_4_);
            local_2800._4_4_ = (float)(uVar22 ^ auVar48._4_4_);
            local_2800._8_4_ = (float)(uVar74 ^ auVar48._8_4_);
            local_2800._12_4_ = (float)(uVar75 ^ auVar48._12_4_);
            fVar65 = *(float *)(ray + k * 4 + 0x60);
            auVar18._4_4_ = local_27e0._4_4_ * fVar65;
            auVar18._0_4_ = local_27e0._0_4_ * fVar65;
            auVar18._8_4_ = local_27e0._8_4_ * fVar65;
            auVar18._12_4_ = local_27e0._12_4_ * fVar65;
            auVar18._16_4_ = local_27e0._16_4_ * fVar65;
            auVar18._20_4_ = local_27e0._20_4_ * fVar65;
            auVar18._24_4_ = local_27e0._24_4_ * fVar65;
            auVar18._28_4_ = fVar65;
            auVar63 = vcmpps_avx(auVar18,local_2800,1);
            fVar65 = *(float *)(ray + k * 4 + 0x100);
            auVar61 = ZEXT3264(CONCAT428(fVar65,CONCAT424(fVar65,CONCAT420(fVar65,CONCAT416(fVar65,
                                                  CONCAT412(fVar65,CONCAT48(fVar65,CONCAT44(fVar65,
                                                  fVar65))))))));
            auVar60._0_4_ = local_27e0._0_4_ * fVar65;
            auVar60._4_4_ = local_27e0._4_4_ * fVar65;
            auVar60._8_4_ = local_27e0._8_4_ * fVar65;
            auVar60._12_4_ = local_27e0._12_4_ * fVar65;
            auVar60._16_4_ = local_27e0._16_4_ * fVar65;
            auVar60._20_4_ = local_27e0._20_4_ * fVar65;
            auVar60._24_4_ = local_27e0._24_4_ * fVar65;
            auVar60._28_4_ = 0;
            auVar45 = vcmpps_avx(local_2800,auVar60,2);
            auVar63 = vandps_avx(auVar63,auVar45);
            auVar48 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
            auVar43 = vpand_avx(auVar43,auVar48);
            auVar63 = vpmovzxwd_avx2(auVar43);
            auVar63 = vpslld_avx2(auVar63,0x1f);
            if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar63 >> 0x7f,0) != '\0') ||
                  (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar63 >> 0xbf,0) != '\0') ||
                (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar63[0x1f] < '\0') {
              local_28c0 = vpsrad_avx2(auVar63,0x1f);
              local_27c0 = ZEXT1632(auVar44);
              local_27a0 = ZEXT1632(auVar58);
              local_2780 = ZEXT1632(auVar49);
              local_2760 = local_28c0;
              local_2680 = local_25e0;
              pSVar4 = context->scene;
              auVar45 = vrcpps_avx(local_27e0);
              auVar85._8_4_ = 0x3f800000;
              auVar85._0_8_ = 0x3f8000003f800000;
              auVar85._12_4_ = 0x3f800000;
              auVar85._16_4_ = 0x3f800000;
              auVar85._20_4_ = 0x3f800000;
              auVar85._24_4_ = 0x3f800000;
              auVar85._28_4_ = 0x3f800000;
              auVar48 = vfnmadd213ps_fma(local_27e0,auVar45,auVar85);
              auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar45,auVar45);
              fVar65 = auVar48._0_4_;
              fVar69 = auVar48._4_4_;
              local_2700._4_4_ = fVar69 * local_2800._4_4_;
              local_2700._0_4_ = fVar65 * local_2800._0_4_;
              fVar70 = auVar48._8_4_;
              local_2700._8_4_ = fVar70 * local_2800._8_4_;
              fVar71 = auVar48._12_4_;
              local_2700._12_4_ = fVar71 * local_2800._12_4_;
              local_2700._16_4_ = local_2800._16_4_ * 0.0;
              local_2700._20_4_ = local_2800._20_4_ * 0.0;
              local_2700._24_4_ = local_2800._24_4_ * 0.0;
              local_2700._28_4_ = auVar45._28_4_;
              auVar64 = ZEXT3264(local_2700);
              auVar19._4_4_ = fVar69 * local_2840._4_4_;
              auVar19._0_4_ = fVar65 * local_2840._0_4_;
              auVar19._8_4_ = fVar70 * local_2840._8_4_;
              auVar19._12_4_ = fVar71 * local_2840._12_4_;
              auVar19._16_4_ = local_2800._16_4_ * 0.0;
              auVar19._20_4_ = local_2800._20_4_ * 0.0;
              auVar19._24_4_ = local_2800._24_4_ * 0.0;
              auVar19._28_4_ = local_2800._28_4_;
              auVar45 = vminps_avx(auVar19,auVar85);
              auVar20._4_4_ = fVar69 * local_2820._4_4_;
              auVar20._0_4_ = fVar65 * local_2820._0_4_;
              auVar20._8_4_ = fVar70 * local_2820._8_4_;
              auVar20._12_4_ = fVar71 * local_2820._12_4_;
              auVar20._16_4_ = local_2800._16_4_ * 0.0;
              auVar20._20_4_ = local_2800._20_4_ * 0.0;
              auVar20._24_4_ = local_2800._24_4_ * 0.0;
              auVar20._28_4_ = local_2800._28_4_;
              auVar50 = vminps_avx(auVar20,auVar85);
              auVar39 = vsubps_avx(auVar85,auVar45);
              auVar66 = vsubps_avx(auVar85,auVar50);
              local_2720 = vblendvps_avx(auVar50,auVar39,local_25e0);
              local_2740 = vblendvps_avx(auVar45,auVar66,local_25e0);
              fVar65 = local_2600._0_4_;
              local_26e0._0_4_ = auVar44._0_4_ * fVar65;
              fVar69 = local_2600._4_4_;
              local_26e0._4_4_ = auVar44._4_4_ * fVar69;
              fVar70 = local_2600._8_4_;
              local_26e0._8_4_ = auVar44._8_4_ * fVar70;
              fVar71 = local_2600._12_4_;
              local_26e0._12_4_ = auVar44._12_4_ * fVar71;
              fVar9 = local_2600._16_4_;
              local_26e0._16_4_ = fVar9 * 0.0;
              fVar10 = local_2600._20_4_;
              local_26e0._20_4_ = fVar10 * 0.0;
              fVar11 = local_2600._24_4_;
              local_26e0._24_4_ = fVar11 * 0.0;
              local_26e0._28_4_ = 0;
              local_26c0._0_4_ = fVar65 * auVar58._0_4_;
              local_26c0._4_4_ = fVar69 * auVar58._4_4_;
              local_26c0._8_4_ = fVar70 * auVar58._8_4_;
              local_26c0._12_4_ = fVar71 * auVar58._12_4_;
              local_26c0._16_4_ = fVar9 * 0.0;
              local_26c0._20_4_ = fVar10 * 0.0;
              local_26c0._24_4_ = fVar11 * 0.0;
              local_26c0._28_4_ = 0;
              local_26a0._0_4_ = fVar65 * fVar1;
              local_26a0._4_4_ = fVar69 * fVar2;
              local_26a0._8_4_ = fVar70 * fVar7;
              local_26a0._12_4_ = fVar71 * fVar8;
              local_26a0._16_4_ = fVar9 * 0.0;
              local_26a0._20_4_ = fVar10 * 0.0;
              local_26a0._24_4_ = fVar11 * 0.0;
              local_26a0._28_4_ = 0;
              auVar40._8_4_ = 0x7f800000;
              auVar40._0_8_ = 0x7f8000007f800000;
              auVar40._12_4_ = 0x7f800000;
              auVar40._16_4_ = 0x7f800000;
              auVar40._20_4_ = 0x7f800000;
              auVar40._24_4_ = 0x7f800000;
              auVar40._28_4_ = 0x7f800000;
              auVar63 = vblendvps_avx(auVar40,local_2700,auVar63);
              auVar45 = vshufps_avx(auVar63,auVar63,0xb1);
              auVar45 = vminps_avx(auVar63,auVar45);
              auVar50 = vshufpd_avx(auVar45,auVar45,5);
              auVar45 = vminps_avx(auVar45,auVar50);
              auVar50 = vpermpd_avx2(auVar45,0x4e);
              auVar45 = vminps_avx(auVar45,auVar50);
              auVar63 = vcmpps_avx(auVar63,auVar45,0);
              auVar48 = vpackssdw_avx(auVar63._0_16_,auVar63._16_16_);
              auVar43 = vpand_avx(auVar48,auVar43);
              auVar63 = vpmovzxwd_avx2(auVar43);
              auVar63 = vpslld_avx2(auVar63,0x1f);
              if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar63 >> 0x7f,0) == '\0') &&
                    (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar63 >> 0xbf,0) == '\0') &&
                  (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar63[0x1f]) {
                auVar63 = local_28c0;
              }
              uVar22 = vmovmskps_avx(auVar63);
              uVar26 = 0;
              for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                uVar26 = uVar26 + 1;
              }
              do {
                uVar27 = (ulong)uVar26;
                uVar26 = *(uint *)((long)&local_24e0 + uVar27 * 4);
                pGVar5 = (pSVar4->geometries).items[uVar26].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  *(undefined4 *)(local_28c0 + uVar27 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar86 = *(undefined4 *)(local_2740 + uVar27 * 4);
                    uVar3 = *(undefined4 *)(local_2720 + uVar27 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + uVar27 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_26e0 + uVar27 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_26c0 + uVar27 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_26a0 + uVar27 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar86;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar3;
                    *(undefined4 *)(ray + k * 4 + 0x220) =
                         *(undefined4 *)((long)&local_2860 + uVar27 * 4);
                    *(uint *)(ray + k * 4 + 0x240) = uVar26;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                    break;
                  }
                  local_2660 = auVar64._0_32_;
                  local_28a0 = auVar61._0_32_;
                  local_2640 = auVar91._0_32_;
                  uVar86 = *(undefined4 *)(local_2740 + uVar27 * 4);
                  local_2460._4_4_ = uVar86;
                  local_2460._0_4_ = uVar86;
                  local_2460._8_4_ = uVar86;
                  local_2460._12_4_ = uVar86;
                  local_2460._16_4_ = uVar86;
                  local_2460._20_4_ = uVar86;
                  local_2460._24_4_ = uVar86;
                  local_2460._28_4_ = uVar86;
                  local_2440 = *(undefined4 *)(local_2720 + uVar27 * 4);
                  uVar86 = *(undefined4 *)((long)&local_2860 + uVar27 * 4);
                  auVar54._4_4_ = uVar86;
                  auVar54._0_4_ = uVar86;
                  auVar54._8_4_ = uVar86;
                  auVar54._12_4_ = uVar86;
                  auVar56._16_4_ = uVar86;
                  auVar56._0_16_ = auVar54;
                  auVar56._20_4_ = uVar86;
                  auVar56._24_4_ = uVar86;
                  auVar56._28_4_ = uVar86;
                  uVar86 = *(undefined4 *)(local_26e0 + uVar27 * 4);
                  uVar3 = *(undefined4 *)(local_26c0 + uVar27 * 4);
                  local_24a0._4_4_ = uVar3;
                  local_24a0._0_4_ = uVar3;
                  local_24a0._8_4_ = uVar3;
                  local_24a0._12_4_ = uVar3;
                  local_24a0._16_4_ = uVar3;
                  local_24a0._20_4_ = uVar3;
                  local_24a0._24_4_ = uVar3;
                  local_24a0._28_4_ = uVar3;
                  uVar3 = *(undefined4 *)(local_26a0 + uVar27 * 4);
                  local_2480._4_4_ = uVar3;
                  local_2480._0_4_ = uVar3;
                  local_2480._8_4_ = uVar3;
                  local_2480._12_4_ = uVar3;
                  local_2480._16_4_ = uVar3;
                  local_2480._20_4_ = uVar3;
                  local_2480._24_4_ = uVar3;
                  local_2480._28_4_ = uVar3;
                  auVar49._4_4_ = uVar26;
                  auVar49._0_4_ = uVar26;
                  auVar49._8_4_ = uVar26;
                  auVar49._12_4_ = uVar26;
                  auVar52._16_4_ = uVar26;
                  auVar52._0_16_ = auVar49;
                  auVar52._20_4_ = uVar26;
                  auVar52._24_4_ = uVar26;
                  auVar52._28_4_ = uVar26;
                  local_24c0[0] = (RTCHitN)(char)uVar86;
                  local_24c0[1] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_24c0[2] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_24c0[3] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_24c0[4] = (RTCHitN)(char)uVar86;
                  local_24c0[5] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_24c0[6] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_24c0[7] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_24c0[8] = (RTCHitN)(char)uVar86;
                  local_24c0[9] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_24c0[10] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_24c0[0xb] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_24c0[0xc] = (RTCHitN)(char)uVar86;
                  local_24c0[0xd] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_24c0[0xe] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_24c0[0xf] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_24c0[0x10] = (RTCHitN)(char)uVar86;
                  local_24c0[0x11] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_24c0[0x12] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_24c0[0x13] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_24c0[0x14] = (RTCHitN)(char)uVar86;
                  local_24c0[0x15] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_24c0[0x16] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_24c0[0x17] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_24c0[0x18] = (RTCHitN)(char)uVar86;
                  local_24c0[0x19] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_24c0[0x1a] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_24c0[0x1b] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  local_24c0[0x1c] = (RTCHitN)(char)uVar86;
                  local_24c0[0x1d] = (RTCHitN)(char)((uint)uVar86 >> 8);
                  local_24c0[0x1e] = (RTCHitN)(char)((uint)uVar86 >> 0x10);
                  local_24c0[0x1f] = (RTCHitN)(char)((uint)uVar86 >> 0x18);
                  uStack_243c = local_2440;
                  uStack_2438 = local_2440;
                  uStack_2434 = local_2440;
                  uStack_2430 = local_2440;
                  uStack_242c = local_2440;
                  uStack_2428 = local_2440;
                  uStack_2424 = local_2440;
                  local_2420 = auVar56;
                  local_2400 = auVar52;
                  vpcmpeqd_avx2(local_2460,local_2460);
                  uStack_23dc = context->user->instID[0];
                  local_23e0 = uStack_23dc;
                  uStack_23d8 = uStack_23dc;
                  uStack_23d4 = uStack_23dc;
                  uStack_23d0 = uStack_23dc;
                  uStack_23cc = uStack_23dc;
                  uStack_23c8 = uStack_23dc;
                  uStack_23c4 = uStack_23dc;
                  uStack_23bc = context->user->instPrimID[0];
                  local_23c0 = uStack_23bc;
                  uStack_23b8 = uStack_23bc;
                  uStack_23b4 = uStack_23bc;
                  uStack_23b0 = uStack_23bc;
                  uStack_23ac = uStack_23bc;
                  uStack_23a8 = uStack_23bc;
                  uStack_23a4 = uStack_23bc;
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2700 + uVar27 * 4);
                  local_2880 = local_2620;
                  local_28f0.valid = (int *)local_2880;
                  local_28f0.geometryUserPtr = pGVar5->userPtr;
                  local_28f0.context = context->user;
                  local_28f0.hit = local_24c0;
                  local_28f0.N = 8;
                  local_28f0.ray = (RTCRayN *)ray;
                  if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar52 = ZEXT1632(auVar49);
                    auVar56 = ZEXT1632(auVar54);
                    (*pGVar5->intersectionFilterN)(&local_28f0);
                  }
                  auVar45 = vpcmpeqd_avx2(local_2880,_DAT_01faff00);
                  auVar63 = _DAT_01fe9960 & ~auVar45;
                  if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar63 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar63 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar63 >> 0x7f,0) == '\0') &&
                        (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar63 >> 0xbf,0) == '\0') &&
                      (auVar63 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar63[0x1f]) {
                    auVar45 = auVar45 ^ _DAT_01fe9960;
                  }
                  else {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar52 = ZEXT1632(auVar52._0_16_);
                      auVar56 = ZEXT1632(auVar56._0_16_);
                      (*p_Var6)(&local_28f0);
                    }
                    auVar50 = vpcmpeqd_avx2(local_2880,_DAT_01faff00);
                    auVar63 = vpcmpeqd_avx2(auVar56,auVar56);
                    auVar45 = auVar50 ^ auVar63;
                    auVar39 = vpcmpeqd_avx2(auVar52,auVar52);
                    auVar63 = auVar63 & ~auVar50;
                    if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar63 >> 0x7f,0) != '\0') ||
                          (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar63 >> 0xbf,0) != '\0') ||
                        (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar63[0x1f] < '\0') {
                      auVar50 = auVar50 ^ auVar39;
                      auVar63 = vmaskmovps_avx(auVar50,*(undefined1 (*) [32])local_28f0.hit);
                      *(undefined1 (*) [32])(local_28f0.ray + 0x180) = auVar63;
                      auVar63 = vmaskmovps_avx(auVar50,*(undefined1 (*) [32])(local_28f0.hit + 0x20)
                                              );
                      *(undefined1 (*) [32])(local_28f0.ray + 0x1a0) = auVar63;
                      auVar63 = vmaskmovps_avx(auVar50,*(undefined1 (*) [32])(local_28f0.hit + 0x40)
                                              );
                      *(undefined1 (*) [32])(local_28f0.ray + 0x1c0) = auVar63;
                      auVar63 = vmaskmovps_avx(auVar50,*(undefined1 (*) [32])(local_28f0.hit + 0x60)
                                              );
                      *(undefined1 (*) [32])(local_28f0.ray + 0x1e0) = auVar63;
                      auVar63 = vmaskmovps_avx(auVar50,*(undefined1 (*) [32])(local_28f0.hit + 0x80)
                                              );
                      *(undefined1 (*) [32])(local_28f0.ray + 0x200) = auVar63;
                      auVar63 = vpmaskmovd_avx2(auVar50,*(undefined1 (*) [32])
                                                         (local_28f0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_28f0.ray + 0x220) = auVar63;
                      auVar63 = vpmaskmovd_avx2(auVar50,*(undefined1 (*) [32])
                                                         (local_28f0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_28f0.ray + 0x240) = auVar63;
                      auVar63 = vpmaskmovd_avx2(auVar50,*(undefined1 (*) [32])
                                                         (local_28f0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_28f0.ray + 0x260) = auVar63;
                      auVar63 = vpmaskmovd_avx2(auVar50,*(undefined1 (*) [32])
                                                         (local_28f0.hit + 0x100));
                      *(undefined1 (*) [32])(local_28f0.ray + 0x280) = auVar63;
                    }
                  }
                  if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar45 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar45 >> 0x7f,0) == '\0') &&
                        (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar45 >> 0xbf,0) == '\0') &&
                      (auVar45 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar45[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_28a0._0_4_;
                  }
                  else {
                    local_28a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_28c0 + uVar27 * 4) = 0;
                  auVar61 = ZEXT3264(local_28a0);
                  uVar86 = local_28a0._0_4_;
                  auVar41._4_4_ = uVar86;
                  auVar41._0_4_ = uVar86;
                  auVar41._8_4_ = uVar86;
                  auVar41._12_4_ = uVar86;
                  auVar41._16_4_ = uVar86;
                  auVar41._20_4_ = uVar86;
                  auVar41._24_4_ = uVar86;
                  auVar41._28_4_ = uVar86;
                  auVar64 = ZEXT3264(local_2660);
                  auVar63 = vcmpps_avx(local_2660,auVar41,2);
                  local_28c0 = vandps_avx(auVar63,local_28c0);
                  auVar91 = ZEXT3264(local_2640);
                }
                if ((((((((local_28c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_28c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_28c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_28c0 >> 0x7f,0) == '\0') &&
                      (local_28c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_28c0 >> 0xbf,0) == '\0') &&
                    (local_28c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_28c0[0x1f]) break;
                auVar47._8_4_ = 0x7f800000;
                auVar47._0_8_ = 0x7f8000007f800000;
                auVar47._12_4_ = 0x7f800000;
                auVar47._16_4_ = 0x7f800000;
                auVar47._20_4_ = 0x7f800000;
                auVar47._24_4_ = 0x7f800000;
                auVar47._28_4_ = 0x7f800000;
                auVar63 = vblendvps_avx(auVar47,auVar64._0_32_,local_28c0);
                auVar45 = vshufps_avx(auVar63,auVar63,0xb1);
                auVar45 = vminps_avx(auVar63,auVar45);
                auVar50 = vshufpd_avx(auVar45,auVar45,5);
                auVar45 = vminps_avx(auVar45,auVar50);
                auVar50 = vpermpd_avx2(auVar45,0x4e);
                auVar45 = vminps_avx(auVar45,auVar50);
                auVar45 = vcmpps_avx(auVar63,auVar45,0);
                auVar50 = local_28c0 & auVar45;
                auVar63 = local_28c0;
                if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar50 >> 0x7f,0) != '\0') ||
                      (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar50 >> 0xbf,0) != '\0') ||
                    (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar50[0x1f] < '\0') {
                  auVar63 = vandps_avx(auVar45,local_28c0);
                }
                uVar22 = vmovmskps_avx(auVar63);
                uVar26 = 0;
                for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
                  uVar26 = uVar26 + 1;
                }
              } while( true );
            }
          }
          lVar33 = lVar33 + 1;
        } while (lVar33 != uVar35 - 8);
      }
      uVar86 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar42 = ZEXT3264(CONCAT428(uVar86,CONCAT424(uVar86,CONCAT420(uVar86,CONCAT416(uVar86,
                                                  CONCAT412(uVar86,CONCAT48(uVar86,CONCAT44(uVar86,
                                                  uVar86))))))));
      auVar61 = ZEXT3264(local_2520);
      auVar64 = ZEXT3264(local_2540);
      auVar68 = ZEXT3264(local_2560);
      auVar73 = ZEXT3264(local_2580);
      auVar79 = ZEXT3264(local_25a0);
      auVar82 = ZEXT3264(local_25c0);
    }
    if (pauVar23 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }